

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuStringInsert(CuString *str,char *text,int pos)

{
  int iVar1;
  size_t sVar2;
  int local_1c;
  int length;
  int pos_local;
  char *text_local;
  CuString *str_local;
  
  sVar2 = strlen(text);
  iVar1 = (int)sVar2;
  local_1c = pos;
  if (str->length < pos) {
    local_1c = str->length;
  }
  if (str->size <= str->length + iVar1 + 1) {
    CuStringResize(str,str->length + iVar1 + 0x101);
  }
  memmove(str->buffer + (long)iVar1 + (long)local_1c,str->buffer + local_1c,
          (long)((str->length - local_1c) + 1));
  str->length = iVar1 + str->length;
  memcpy(str->buffer + local_1c,text,(long)iVar1);
  return;
}

Assistant:

void CuStringInsert(CuString* str, const char* text, int pos)
{
	int length = strlen(text);
	if (pos > str->length)
		pos = str->length;
	if (str->length + length + 1 >= str->size)
		CuStringResize(str, str->length + length + 1 + STRING_INC);
	memmove(str->buffer + pos + length, str->buffer + pos, (str->length - pos) + 1);
	str->length += length;
	memcpy(str->buffer + pos, text, length);
}